

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O3

void ProcessEDSector(sector_t_conflict *sec,int recordnum)

{
  short sVar1;
  Node *pNVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  Node *pNVar7;
  long lVar8;
  short sVar9;
  
  pNVar2 = EDSectors.Nodes + (EDSectors.Size - 1 & recordnum);
  while ((pNVar7 = pNVar2, pNVar7 != (Node *)0x0 && (pNVar7->Next != (Node *)0x1))) {
    pNVar2 = pNVar7->Next;
    if ((pNVar7->Pair).Key == recordnum) {
      uVar6 = sec->Flags & 0x3fffff8e;
      if ((pNVar7->Pair).Value.flagsSet == false) {
        uVar6 = sec->Flags;
      }
      uVar6 = ~(pNVar7->Pair).Value.flagsRemove &
              (uVar6 | (pNVar7->Pair).Value.flags | (pNVar7->Pair).Value.flagsAdd);
      if ((pNVar7->Pair).Value.damageflagsSet == true) {
        uVar6 = uVar6 & 0xfffff87f;
        bVar4 = 0;
      }
      else {
        bVar4 = 2;
        if (sec->leakydamage < 0x100) {
          bVar4 = 4 < sec->leakydamage;
        }
      }
      sec->Flags = ~(pNVar7->Pair).Value.damageflagsRemove &
                   (uVar6 | (pNVar7->Pair).Value.damageflags | (pNVar7->Pair).Value.damageflagsAdd);
      bVar4 = ~(pNVar7->Pair).Value.leakyremove &
              (bVar4 | (pNVar7->Pair).Value.leaky | (pNVar7->Pair).Value.leakyadd);
      sVar9 = 0x100;
      if (bVar4 == 1) {
        sVar9 = 5;
      }
      sVar1 = 0;
      if (bVar4 != 0) {
        sVar1 = sVar9;
      }
      sec->leakydamage = sVar1;
      sec->damageamount = (pNVar7->Pair).Value.damageamount;
      sec->damageinterval = (short)(pNVar7->Pair).Value.damageinterval;
      (sec->damagetype).super_FName.Index = (pNVar7->Pair).Value.damagetype.super_FName.Index;
      sec->terrainnum[0] = (pNVar7->Pair).Value.floorterrain;
      sec->terrainnum[1] = (pNVar7->Pair).Value.ceilingterrain;
      if ((pNVar7->Pair).Value.colorSet == true) {
        uVar6 = (pNVar7->Pair).Value.color;
        sector_t::SetColor((sector_t *)sec,uVar6 >> 0x10 & 0xff,uVar6 >> 8 & 0xff,uVar6 & 0xff,0);
      }
      lVar8 = 0;
      bVar3 = true;
      do {
        bVar5 = bVar3;
        sec->planes[lVar8].xform.xOffs = (pNVar7->Pair).Value.xoffs[lVar8];
        sec->planes[lVar8].xform.yOffs = (pNVar7->Pair).Value.yoffs[lVar8];
        sec->planes[lVar8].xform.Angle.Degrees = (pNVar7->Pair).Value.angle[lVar8].Degrees;
        sec->planes[lVar8].alpha = (pNVar7->Pair).Value.Overlayalpha[lVar8];
        sec->planes[lVar8].Flags =
             sec->planes[lVar8].Flags & 0xffffff83U | (pNVar7->Pair).Value.portalflags[lVar8];
        lVar8 = 1;
        bVar3 = false;
      } while (bVar5);
      return;
    }
  }
  Printf("EDF Sector record %d not found\n");
  return;
}

Assistant:

void ProcessEDSector(sector_t *sec, int recordnum)
{
	EDSector *esec = EDSectors.CheckKey(recordnum);
	if (esec == NULL)
	{
		Printf("EDF Sector record %d not found\n", recordnum);
		return;
	}

	// In ZDoom the regular and the damage flags are part of the same flag word so we need to do some masking.
	const DWORD flagmask = SECF_SECRET | SECF_WASSECRET | SECF_FRICTION | SECF_PUSH | SECF_SILENT | SECF_SILENTMOVE;
	if (esec->flagsSet) sec->Flags = (sec->Flags & ~flagmask);
	sec->Flags = (sec->Flags | esec->flags | esec->flagsAdd) & ~esec->flagsRemove;

	BYTE leak = 0;
	if (esec->damageflagsSet) sec->Flags = (sec->Flags & ~SECF_DAMAGEFLAGS);
	else leak = sec->leakydamage >= 256 ? 2 : sec->leakydamage >= 5 ? 1 : 0;
	sec->Flags = (sec->Flags | esec->damageflags | esec->damageflagsAdd) & ~esec->damageflagsRemove;
	leak = (leak | esec->leaky | esec->leakyadd) & ~esec->leakyremove;

	// the damage properties will be unconditionally overridden by Extradata.
	sec->leakydamage = leak == 0 ? 0 : leak == 1 ? 5 : 256;
	sec->damageamount = esec->damageamount;
	sec->damageinterval = esec->damageinterval;
	sec->damagetype = esec->damagetype;

	sec->terrainnum[sector_t::floor] = esec->floorterrain;
	sec->terrainnum[sector_t::ceiling] = esec->ceilingterrain;

	if (esec->colorSet) sec->SetColor(RPART(esec->color), GPART(esec->color), BPART(esec->color), 0);

	const DWORD pflagmask = PLANEF_DISABLED | PLANEF_NORENDER | PLANEF_NOPASS | PLANEF_BLOCKSOUND | PLANEF_ADDITIVE;
	for (int i = 0; i < 2; i++)
	{
		sec->SetXOffset(i, esec->xoffs[i]);
		sec->SetYOffset(i, esec->yoffs[i]);
		sec->SetAngle(i, esec->angle[i]);
		sec->SetAlpha(i, esec->Overlayalpha[i]);
		sec->planes[i].Flags = (sec->planes[i].Flags & ~pflagmask) | esec->portalflags[i];
	}
}